

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_delegate.cc
# Opt level: O1

void absl::base_internal::anon_unknown_2::Throw<std::logic_error>(logic_error *error)

{
  logic_error *this;
  
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,error);
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

[[noreturn]] void Throw(const T& error) {
#ifdef ABSL_HAVE_EXCEPTIONS
  throw error;
#else
  ABSL_RAW_LOG(FATAL, "%s", error.what());
  std::abort();
#endif
}